

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O1

ktx_error_code_e ktxMemStream_construct(ktxStream *str,ktx_bool_t freeOnDestruct)

{
  ktx_error_code_e kVar1;
  ktxMem *pMem;
  
  if (str != (ktxStream *)0x0) {
    pMem = (ktxMem *)malloc(0x28);
    if (pMem == (ktxMem *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      pMem->alloc_size = 0;
      pMem->used_size = 0;
      pMem->robytes = (ktx_uint8_t *)0x0;
      pMem->bytes = (ktx_uint8_t *)0x0;
      pMem->pos = 0;
      kVar1 = ktxMem_expand(pMem,0x100);
    }
    if (kVar1 == KTX_SUCCESS) {
      (str->data).mem = pMem;
      str->type = eStreamTypeMemory;
      str->read = ktxMemStream_read;
      str->skip = ktxMemStream_skip;
      str->write = ktxMemStream_write;
      str->getpos = ktxMemStream_getpos;
      str->setpos = ktxMemStream_setpos;
      str->getsize = ktxMemStream_getsize;
      str->destruct = ktxMemStream_destruct;
      str->closeOnDestruct = freeOnDestruct;
    }
    return kVar1;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code ktxMemStream_construct(ktxStream* str,
                                      ktx_bool_t freeOnDestruct)
{
    ktxMem* mem;
    KTX_error_code result = KTX_SUCCESS;

    if (!str)
        return KTX_INVALID_VALUE;

    result = ktxMem_create(&mem);

    if (KTX_SUCCESS == result) {
        str->data.mem = mem;
        ktxMemStream_setup(str);
        str->closeOnDestruct = freeOnDestruct;
    }

    return result;
}